

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

LitVec * __thiscall Clasp::mt::ParallelSolve::SharedData::requestWork(SharedData *this,Solver *s)

{
  __int_type_conflict2 _Var1;
  uint uVar2;
  uint uVar3;
  SharedContext *this_00;
  bool bVar4;
  LitVec *pLVar5;
  unique_lock<std::mutex> lock;
  
  if (((this->initVec).super___atomic_base<unsigned_long>._M_i >> ((ulong)s->strategy_ >> 0x3a) & 1)
      == 0) {
LAB_00177037:
    if (((this->control).super___atomic_base<unsigned_int>._M_i & 0x40) == 0) {
      pLVar5 = (LitVec *)0x0;
    }
    else {
      this_00 = this->ctx;
      pLVar5 = (LitVec *)0x0;
      MessageEvent::MessageEvent((MessageEvent *)&lock,s,"SPLIT",sent,0.0);
      SharedContext::report(this_00,(Event *)&lock);
      std::unique_lock<std::mutex>::unique_lock(&lock,&this->workM);
      while (((this->control).super___atomic_base<unsigned_int>._M_i & 3) == 0) {
        uVar2 = (this->workQ).vec.ebo_.size;
        uVar3 = (this->workQ).qFront;
        if (uVar3 != uVar2) {
          (this->workQ).qFront = uVar3 + 1;
          pLVar5 = (this->workQ).vec.ebo_.buf[uVar3];
          if (uVar3 + 1 == uVar2) {
            (this->workQ).vec.ebo_.size = 0;
            (this->workQ).qFront = 0;
          }
          break;
        }
        postMessage(this,msg_split,false);
        bVar4 = enterWait(this,&lock);
        if (!bVar4) break;
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      SharedContext::report(this->ctx,"resume after wait",s);
    }
  }
  else {
    if (((this->control).super___atomic_base<unsigned_int>._M_i & 0x40) == 0) {
      LOCK();
      (this->initVec).super___atomic_base<unsigned_long>._M_i =
           (this->initVec).super___atomic_base<unsigned_long>._M_i -
           (1L << (SUB81(s->strategy_,7) >> 2));
      UNLOCK();
    }
    else {
      LOCK();
      _Var1 = (this->initVec).super___atomic_base<unsigned_long>._M_i;
      (this->initVec).super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if (_Var1 == 0) goto LAB_00177037;
    }
    pLVar5 = this->path;
  }
  return pLVar5;
}

Assistant:

const LitVec* requestWork(const Solver& s) {
		const uint64 m(uint64(1) << s.id());
		if ((initVec & m) == m) {
			if (!allowSplit()) {
				// portfolio mode - all solvers can start with initial path
				initVec -= m;
				return path;
			}
			if (initVec.exchange(0) != 0) {
				// splitting mode - only one solver must start with initial path
				return path;
			}
		}
		if (!allowSplit()) { return 0; }
		ctx->report(MessageEvent(s, "SPLIT", MessageEvent::sent));
		// try to get work from split
		const LitVec* ret = 0;
		for (unique_lock<mutex> lock(workM); !hasControl(uint32(terminate_flag|sync_flag));) {
			if (!workQ.empty()) {
				ret = workQ.pop_ret();
				if (workQ.empty()) { workQ.clear(); }
				break;
			}
			postMessage(msg_split, false);
			if (!enterWait(lock))
				break;
		}
		ctx->report("resume after wait", &s);
		return ret;
	}